

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

aiScene * aiApplyPostProcessing(aiScene *pScene,uint pFlags)

{
  Importer *this;
  aiScene *paVar1;
  
  if (pScene != (aiScene *)0x0) {
    if (((undefined8 *)pScene->mPrivate != (undefined8 *)0x0) &&
       (this = *pScene->mPrivate, this != (Importer *)0x0)) {
      paVar1 = Assimp::Importer::ApplyPostProcessing(this,pFlags);
      if (paVar1 == (aiScene *)0x0) {
        aiReleaseImport(pScene);
        paVar1 = (aiScene *)0x0;
      }
      return paVar1;
    }
    ReportSceneNotFoundError();
  }
  __assert_fail("nullptr != in",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/ScenePrivate.h"
                ,0x60,"const ScenePrivateData *Assimp::ScenePriv(const aiScene *)");
}

Assistant:

ASSIMP_API const aiScene* aiApplyPostProcessing(const aiScene* pScene,
    unsigned int pFlags)
{
    const aiScene* sc = NULL;


    ASSIMP_BEGIN_EXCEPTION_REGION();

    // find the importer associated with this data
    const ScenePrivateData* priv = ScenePriv(pScene);
    if( !priv || !priv->mOrigImporter)  {
        ReportSceneNotFoundError();
        return NULL;
    }

    sc = priv->mOrigImporter->ApplyPostProcessing(pFlags);

    if (!sc) {
        aiReleaseImport(pScene);
        return NULL;
    }

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return sc;
}